

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void idtx16x16_sse4_1(__m128i *in,__m128i *out,int bit,int col_num)

{
  int *piVar1;
  ulong uVar2;
  long lVar3;
  undefined1 in_XMM0 [16];
  undefined1 auVar4 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if (0 < col_num) {
    uVar2 = 1;
    if (1 < col_num * 0x10) {
      uVar2 = (ulong)(uint)(col_num * 0x10);
    }
    lVar3 = 0;
    auVar4 = pmovsxwd(in_XMM0,0x2d422d422d422d42);
    auVar5 = pmovsxwd(in_XMM1,0x800080008000800);
    do {
      auVar6 = pmulld(*(undefined1 (*) [16])((long)*in + lVar3),auVar4);
      piVar1 = (int *)((long)*out + lVar3);
      *piVar1 = auVar6._0_4_ + auVar5._0_4_ >> 0xc;
      piVar1[1] = auVar6._4_4_ + auVar5._4_4_ >> 0xc;
      piVar1[2] = auVar6._8_4_ + auVar5._8_4_ >> 0xc;
      piVar1[3] = auVar6._12_4_ + auVar5._12_4_ >> 0xc;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 * 0x10 != lVar3);
  }
  return;
}

Assistant:

static void idtx16x16_sse4_1(__m128i *in, __m128i *out, int bit, int col_num) {
  (void)bit;
  __m128i fact = _mm_set1_epi32(2 * NewSqrt2);
  __m128i offset = _mm_set1_epi32(1 << (NewSqrt2Bits - 1));
  __m128i a_low;

  int num_iters = 16 * col_num;
  for (int i = 0; i < num_iters; i++) {
    a_low = _mm_mullo_epi32(in[i], fact);
    a_low = _mm_add_epi32(a_low, offset);
    out[i] = _mm_srai_epi32(a_low, NewSqrt2Bits);
  }
}